

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveObjectsWriter.cpp
# Opt level: O3

void __thiscall
PrimitiveObjectsWriter::WriteInteger
          (PrimitiveObjectsWriter *this,longlong inIntegerToken,ETokenSeparator inSeparate)

{
  IByteWriter *pIVar1;
  size_t sVar2;
  char buffer [512];
  char acStack_228 [520];
  
  if (this->mStreamForWriting != (IByteWriter *)0x0) {
    sprintf(acStack_228,"%lld",inIntegerToken);
    pIVar1 = this->mStreamForWriting;
    sVar2 = strlen(acStack_228);
    (*pIVar1->_vptr_IByteWriter[2])(pIVar1,acStack_228,sVar2);
    WriteTokenSeparator(this,inSeparate);
  }
  return;
}

Assistant:

void PrimitiveObjectsWriter::WriteInteger(long long inIntegerToken,ETokenSeparator inSeparate)
{
	if(!mStreamForWriting)
		return;
	char buffer[512];

	SAFE_SPRINTF_1(buffer,512,"%lld",inIntegerToken);
	mStreamForWriting->Write((const IOBasicTypes::Byte *)buffer,strlen(buffer));
	WriteTokenSeparator(inSeparate);
}